

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O2

StandardFileCommon *
chatra::emb::io::StandardFileSystem::doOpenFile(string *fileName,Type_conflict flags)

{
  int *piVar1;
  FILE *pFVar2;
  StandardFileCommon *this;
  IllegalArgumentException *this_00;
  undefined8 *puVar3;
  string *fileName_00;
  string local_98;
  string local_78;
  string local_58;
  size_t local_38;
  
  if ((~flags & 6) == 0) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    pFVar2 = fopen((fileName->_M_dataplus)._M_p,"r+b");
    if (pFVar2 == (FILE *)0x0) {
      if (*piVar1 != 2) {
LAB_001afa7a:
        this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
        IllegalArgumentException::IllegalArgumentException
                  (this_00,"cannot open file: %s",(fileName->_M_dataplus)._M_p);
        __cxa_throw(this_00,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
      }
      pFVar2 = fopen((fileName->_M_dataplus)._M_p,"wb");
      if (pFVar2 == (FILE *)0x0) goto LAB_001afa7a;
    }
    local_38 = getFileLengthOrClose(fileName,(FILE *)pFVar2);
    this = (StandardFileCommon *)operator_new(0x48);
    fileName_00 = &local_78;
    std::__cxx11::string::string((string *)fileName_00,(string *)fileName);
    WriteStandardFile::WriteStandardFile
              ((WriteStandardFile *)this,fileName_00,flags,(FILE *)pFVar2,local_38,true);
  }
  else if ((flags & 2) == 0) {
    if ((flags & 1) == 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
      puVar3[2] = 0;
      puVar3[3] = 0;
      puVar3[4] = 0;
      puVar3[1] = puVar3 + 3;
      *(undefined1 *)(puVar3 + 3) = 0;
      *puVar3 = &PTR__NativeException_0023ce78;
      __cxa_throw(puVar3,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
    }
    pFVar2 = fopen((fileName->_M_dataplus)._M_p,"rb");
    local_38 = getFileLengthOrClose(fileName,(FILE *)pFVar2);
    this = (StandardFileCommon *)operator_new(0x48);
    fileName_00 = &local_98;
    std::__cxx11::string::string((string *)fileName_00,(string *)fileName);
    ReadStandardFile::StandardFileCommon
              ((ReadStandardFile *)this,fileName_00,flags,(FILE *)pFVar2,local_38);
  }
  else {
    pFVar2 = fopen((fileName->_M_dataplus)._M_p,"wb");
    this = (StandardFileCommon *)operator_new(0x48);
    fileName_00 = &local_58;
    std::__cxx11::string::string((string *)fileName_00,(string *)fileName);
    WriteStandardFile::WriteStandardFile
              ((WriteStandardFile *)this,fileName_00,flags,(FILE *)pFVar2,0,false);
  }
  std::__cxx11::string::~string((string *)fileName_00);
  return this;
}

Assistant:

static StandardFileCommon *doOpenFile(std::string fileName, FileOpenFlags::Type flags) {
		if ((flags & FileOpenFlags::Write) && (flags & FileOpenFlags::Append)) {
			errno = 0;
			auto fp = std::fopen(fileName.data(), "r+b");
			if (fp == nullptr && errno == ENOENT)
				fp = std::fopen(fileName.data(), "wb");
			if (fp == nullptr)
				throw IllegalArgumentException("cannot open file: %s", fileName.data());

			size_t length = getFileLengthOrClose(fileName, fp);
			return new WriteStandardFile(std::move(fileName), flags, fp, length, true);
		}
		else if (flags & FileOpenFlags::Write) {
			auto fp = std::fopen(fileName.data(), "wb");
			return new WriteStandardFile(std::move(fileName), flags, fp, 0, false);
		}
		else if (flags & FileOpenFlags::Read) {
			auto fp = std::fopen(fileName.data(), "rb");
			size_t length = getFileLengthOrClose(fileName, fp);
			return new ReadStandardFile(std::move(fileName), flags, fp, length);
		}
		else
			throw IllegalArgumentException();
	}